

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_tests.cpp
# Opt level: O1

Result<result_tests::NoCopy> *
result_tests::NoCopyFn(Result<result_tests::NoCopy> *__return_storage_ptr__,int i,bool success)

{
  undefined8 *puVar1;
  int *piVar2;
  undefined7 in_register_00000011;
  long in_FS_OFFSET;
  int local_8c;
  string local_88;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_8c = i;
  if ((int)CONCAT71(in_register_00000011,success) == 0) {
    tinyformat::format<int>(&local_88,"nocopy %i error.",&local_8c);
    local_68 = &local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,local_88._M_dataplus._M_p,
               local_88._M_dataplus._M_p + local_88._M_string_length);
    local_48 = &local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,local_88._M_dataplus._M_p,
               local_88._M_dataplus._M_p + local_88._M_string_length);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_result_tests::NoCopy>.
                     super__Move_assign_alias<bilingual_str,_result_tests::NoCopy>.
                     super__Copy_assign_alias<bilingual_str,_result_tests::NoCopy>.
                     super__Move_ctor_alias<bilingual_str,_result_tests::NoCopy>.
                     super__Copy_ctor_alias<bilingual_str,_result_tests::NoCopy>.
                     super__Variant_storage_alias<bilingual_str,_result_tests::NoCopy> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_result_tests::NoCopy>.
      super__Move_assign_alias<bilingual_str,_result_tests::NoCopy>.
      super__Copy_assign_alias<bilingual_str,_result_tests::NoCopy>.
      super__Move_ctor_alias<bilingual_str,_result_tests::NoCopy>.
      super__Copy_ctor_alias<bilingual_str,_result_tests::NoCopy>.
      super__Variant_storage_alias<bilingual_str,_result_tests::NoCopy> = puVar1;
    if (local_68 == &local_58) {
      *puVar1 = CONCAT71(uStack_57,local_58);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_result_tests::NoCopy>.
               super__Move_assign_alias<bilingual_str,_result_tests::NoCopy>.
               super__Copy_assign_alias<bilingual_str,_result_tests::NoCopy>.
               super__Move_ctor_alias<bilingual_str,_result_tests::NoCopy>.
               super__Copy_ctor_alias<bilingual_str,_result_tests::NoCopy>.
               super__Variant_storage_alias<bilingual_str,_result_tests::NoCopy> + 0x18) = uStack_50
      ;
    }
    else {
      *(undefined1 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_result_tests::NoCopy>
        .super__Move_assign_alias<bilingual_str,_result_tests::NoCopy>.
        super__Copy_assign_alias<bilingual_str,_result_tests::NoCopy>.
        super__Move_ctor_alias<bilingual_str,_result_tests::NoCopy>.
        super__Copy_ctor_alias<bilingual_str,_result_tests::NoCopy>.
        super__Variant_storage_alias<bilingual_str,_result_tests::NoCopy> = local_68;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_result_tests::NoCopy>.
                        super__Move_assign_alias<bilingual_str,_result_tests::NoCopy>.
                        super__Copy_assign_alias<bilingual_str,_result_tests::NoCopy>.
                        super__Move_ctor_alias<bilingual_str,_result_tests::NoCopy>.
                        super__Copy_ctor_alias<bilingual_str,_result_tests::NoCopy>.
                        super__Variant_storage_alias<bilingual_str,_result_tests::NoCopy> + 0x10) =
           CONCAT71(uStack_57,local_58);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_result_tests::NoCopy>.
             super__Move_assign_alias<bilingual_str,_result_tests::NoCopy>.
             super__Copy_assign_alias<bilingual_str,_result_tests::NoCopy>.
             super__Move_ctor_alias<bilingual_str,_result_tests::NoCopy>.
             super__Copy_ctor_alias<bilingual_str,_result_tests::NoCopy>.
             super__Variant_storage_alias<bilingual_str,_result_tests::NoCopy> + 8) = local_60;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_result_tests::NoCopy>.
                     super__Move_assign_alias<bilingual_str,_result_tests::NoCopy>.
                     super__Copy_assign_alias<bilingual_str,_result_tests::NoCopy>.
                     super__Move_ctor_alias<bilingual_str,_result_tests::NoCopy>.
                     super__Copy_ctor_alias<bilingual_str,_result_tests::NoCopy>.
                     super__Variant_storage_alias<bilingual_str,_result_tests::NoCopy> + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_result_tests::NoCopy>.
             super__Move_assign_alias<bilingual_str,_result_tests::NoCopy>.
             super__Copy_assign_alias<bilingual_str,_result_tests::NoCopy>.
             super__Move_ctor_alias<bilingual_str,_result_tests::NoCopy>.
             super__Copy_ctor_alias<bilingual_str,_result_tests::NoCopy>.
             super__Variant_storage_alias<bilingual_str,_result_tests::NoCopy> + 0x20) = puVar1;
    if (local_48 == &local_38) {
      *puVar1 = CONCAT71(uStack_37,local_38);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_result_tests::NoCopy>.
               super__Move_assign_alias<bilingual_str,_result_tests::NoCopy>.
               super__Copy_assign_alias<bilingual_str,_result_tests::NoCopy>.
               super__Move_ctor_alias<bilingual_str,_result_tests::NoCopy>.
               super__Copy_ctor_alias<bilingual_str,_result_tests::NoCopy>.
               super__Variant_storage_alias<bilingual_str,_result_tests::NoCopy> + 0x38) = uStack_30
      ;
    }
    else {
      *(undefined1 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_result_tests::NoCopy>.
               super__Move_assign_alias<bilingual_str,_result_tests::NoCopy>.
               super__Copy_assign_alias<bilingual_str,_result_tests::NoCopy>.
               super__Move_ctor_alias<bilingual_str,_result_tests::NoCopy>.
               super__Copy_ctor_alias<bilingual_str,_result_tests::NoCopy>.
               super__Variant_storage_alias<bilingual_str,_result_tests::NoCopy> + 0x20) = local_48;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_result_tests::NoCopy>.
                        super__Move_assign_alias<bilingual_str,_result_tests::NoCopy>.
                        super__Copy_assign_alias<bilingual_str,_result_tests::NoCopy>.
                        super__Move_ctor_alias<bilingual_str,_result_tests::NoCopy>.
                        super__Copy_ctor_alias<bilingual_str,_result_tests::NoCopy>.
                        super__Variant_storage_alias<bilingual_str,_result_tests::NoCopy> + 0x30) =
           CONCAT71(uStack_37,local_38);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_result_tests::NoCopy>.
             super__Move_assign_alias<bilingual_str,_result_tests::NoCopy>.
             super__Copy_assign_alias<bilingual_str,_result_tests::NoCopy>.
             super__Move_ctor_alias<bilingual_str,_result_tests::NoCopy>.
             super__Copy_ctor_alias<bilingual_str,_result_tests::NoCopy>.
             super__Variant_storage_alias<bilingual_str,_result_tests::NoCopy> + 0x28) = local_40;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_result_tests::NoCopy>.
             super__Move_assign_alias<bilingual_str,_result_tests::NoCopy>.
             super__Copy_assign_alias<bilingual_str,_result_tests::NoCopy>.
             super__Move_ctor_alias<bilingual_str,_result_tests::NoCopy>.
             super__Copy_ctor_alias<bilingual_str,_result_tests::NoCopy>.
             super__Variant_storage_alias<bilingual_str,_result_tests::NoCopy> + 0x40) = '\0';
    local_38 = 0;
    local_40 = 0;
    local_58 = 0;
    local_60 = 0;
    local_68 = &local_58;
    local_48 = &local_38;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    piVar2 = (int *)operator_new(4);
    *piVar2 = i;
    *(int **)&(__return_storage_ptr__->m_variant).
              super__Variant_base<bilingual_str,_result_tests::NoCopy>.
              super__Move_assign_alias<bilingual_str,_result_tests::NoCopy>.
              super__Copy_assign_alias<bilingual_str,_result_tests::NoCopy>.
              super__Move_ctor_alias<bilingual_str,_result_tests::NoCopy>.
              super__Copy_ctor_alias<bilingual_str,_result_tests::NoCopy>.
              super__Variant_storage_alias<bilingual_str,_result_tests::NoCopy> = piVar2;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_result_tests::NoCopy>.
             super__Move_assign_alias<bilingual_str,_result_tests::NoCopy>.
             super__Copy_assign_alias<bilingual_str,_result_tests::NoCopy>.
             super__Move_ctor_alias<bilingual_str,_result_tests::NoCopy>.
             super__Copy_ctor_alias<bilingual_str,_result_tests::NoCopy>.
             super__Variant_storage_alias<bilingual_str,_result_tests::NoCopy> + 0x40) = '\x01';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<NoCopy> NoCopyFn(int i, bool success)
{
    if (success) return {i};
    return util::Error{Untranslated(strprintf("nocopy %i error.", i))};
}